

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O2

void borg_flow_direct(int y,int x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  uint uVar10;
  uint uVar11;
  borg_grid *ag;
  uint8_t *puVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int local_54;
  int local_50;
  
  if (borg_data_icky->data[(uint)y][(uint)x] != '\0') {
    return;
  }
  if (borg_data_know->data[(uint)y][(uint)x] == '\0') {
    borg_data_know->data[(uint)y][(uint)x] = '\x01';
    wVar5 = borg_danger(y,x,L'\x01',true,false);
    iVar13 = (int)avoidance;
    if (borg.trait[0x24] == 0x32) {
      wVar6 = (wchar_t)(avoidance / 2);
    }
    else {
      wVar6 = (iVar13 * 3) / 10;
    }
    wVar7 = iVar13 * 2;
    if (scaryguy_on_level == false) {
      wVar7 = wVar6;
    }
    if (((unique_on_level != 0) && (vault_on_level == true)) && (borg.trait[0x24] == 0x32)) {
      wVar7 = iVar13 * 3;
    }
    wVar6 = iVar13 * 3;
    if (scaryguy_on_level == false) {
      wVar6 = wVar7;
    }
    if (5 < borg.trait[0x23]) {
      wVar6 = wVar7;
    }
    wVar7 = iVar13 * 5;
    if (borg.goal.ignoring == false) {
      wVar7 = wVar6;
    }
    wVar6 = iVar13 * 0x19;
    if (borg_t - borg_began < 0x1389) {
      wVar6 = wVar7;
    }
    wVar7 = iVar13 * 100;
    if (borg.trait[0x27] != 0) {
      wVar7 = wVar6;
    }
    if (borg.trait[0x23] == 0) {
      wVar7 = (wchar_t)(avoidance / 10);
    }
    if (wVar7 < wVar5) {
      puVar12 = borg_data_icky->data[(uint)y] + (uint)x;
LAB_0020608e:
      *puVar12 = '\x01';
      return;
    }
  }
  borg_data_cost->data[(uint)y][(uint)x] = '\0';
  iVar3 = borg.c.y;
  iVar13 = borg.c.x;
  uVar10 = borg.c.y - y;
  uVar1 = -uVar10;
  if (0 < (int)uVar10) {
    uVar1 = uVar10;
  }
  uVar14 = borg.c.x - x;
  uVar2 = -uVar14;
  if (0 < (int)uVar14) {
    uVar2 = uVar14;
  }
  local_50 = (int)(uVar2 - 1) / 2;
  local_54 = (int)(uVar1 - 1) / 2;
  uVar11 = y - borg.c.y;
  if (y - borg.c.y <= (int)uVar10) {
    uVar11 = uVar10;
  }
  uVar10 = x - borg.c.x;
  if (x - borg.c.x <= (int)uVar14) {
    uVar10 = uVar14;
  }
  uVar14 = 0xffffffff;
  uVar18 = 1;
  wVar5 = y;
  wVar6 = x;
  do {
    local_50 = local_50 + uVar11;
    local_54 = local_54 + uVar10;
    if ((wVar6 == iVar13) && (wVar5 == iVar3)) {
      return;
    }
    if (uVar2 < uVar1) {
      uVar17 = -(local_54 / (int)uVar1);
      if (x <= iVar13) {
        uVar17 = local_54 / (int)uVar1;
      }
      uVar16 = uVar18;
      if (iVar3 < y) {
        uVar16 = uVar14;
      }
    }
    else {
      uVar16 = -(local_50 / (int)uVar2);
      if (y <= iVar3) {
        uVar16 = local_50 / (int)uVar2;
      }
      uVar17 = uVar18;
      if (iVar13 < x) {
        uVar17 = uVar14;
      }
    }
    wVar5 = uVar16 + y;
    wVar6 = uVar17 + x;
    ag = borg_grids[wVar5] + wVar6;
    _Var4 = borg_cave_floor_grid(ag);
    if (!_Var4) {
      return;
    }
    if ((ag->feat == '\x17') && (borg.trait[0x40] == 0)) {
      return;
    }
    if (((ag->trap == true) && ((int)avoidance <= borg.trait[0x1b])) && (scaryguy_on_level == false)
       ) {
      if (borg.trait[0x1b] < 0x3c) {
        return;
      }
      if (borg.trait[0x36] < 0x1e) {
        if (borg.trait[0x23] < 0x14) {
          return;
        }
      }
      else if (((uint)borg.trait[0x36] < 0x2d) && (borg.trait[0x23] < 10)) {
        return;
      }
      if (borg.trait[0x37] < 0x1e) {
        if (borg.trait[0x23] < 0x14) {
          return;
        }
      }
      else if (((uint)borg.trait[0x37] < 0x2d) && (borg.trait[0x23] < 10)) {
        return;
      }
    }
    if (borg_data_icky->data[wVar5][wVar6] != '\0') {
      return;
    }
    if (borg_data_know->data[wVar5][wVar6] == '\0') {
      borg_data_know->data[wVar5][wVar6] = '\x01';
      wVar7 = borg_danger(wVar5,wVar6,L'\x01',true,false);
      iVar15 = (int)avoidance;
      if (borg.trait[0x24] == 0x32) {
        wVar8 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar8 = (iVar15 * 3) / 10;
      }
      wVar9 = iVar15 * 2;
      if (scaryguy_on_level == false) {
        wVar9 = wVar8;
      }
      if (((unique_on_level != 0) && (vault_on_level == true)) && (borg.trait[0x24] == 0x32)) {
        wVar9 = iVar15 * 3;
      }
      wVar8 = iVar15 * 3;
      if (scaryguy_on_level == false) {
        wVar8 = wVar9;
      }
      if (5 < borg.trait[0x23]) {
        wVar8 = wVar9;
      }
      wVar9 = iVar15 * 5;
      if (borg.goal.ignoring == false) {
        wVar9 = wVar8;
      }
      wVar8 = iVar15 * 0x19;
      if (borg_t - borg_began < 0x1389) {
        wVar8 = wVar9;
      }
      wVar9 = iVar15 * 100;
      if (borg.trait[0x27] != 0) {
        wVar9 = wVar8;
      }
      if (borg.trait[0x23] == 0) {
        wVar9 = (wchar_t)(avoidance / 10);
      }
      if (wVar9 < wVar7) {
        puVar12 = borg_data_icky->data[wVar5] + wVar6;
        goto LAB_0020608e;
      }
    }
    if (borg_data_cost->data[wVar5][wVar6] <= uVar18) {
      return;
    }
    borg_data_cost->data[wVar5][wVar6] = (uint8_t)uVar18;
    uVar14 = uVar14 - 1;
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

static void borg_flow_direct(int y, int x)
{
    int n = 0;

    int x1, y1, x2, y2;

    int ay, ax;

    int shift;

    int p, fear = 0;

    borg_grid *ag;

    /* Avoid icky grids */
    if (borg_data_icky->data[y][x])
        return;

    /* Unknown */
    if (!borg_data_know->data[y][x]) {
        /* Mark as known */
        borg_data_know->data[y][x] = true;

        /* Get the danger */
        p = borg_danger(y, x, 1, true, false);

        /* Increase bravery */
        if (borg.trait[BI_MAXCLEVEL] == 50)
            fear = avoidance * 5 / 10;
        if (borg.trait[BI_MAXCLEVEL] != 50)
            fear = avoidance * 3 / 10;
        if (scaryguy_on_level)
            fear = avoidance * 2;
        if (unique_on_level && vault_on_level && borg.trait[BI_MAXCLEVEL] == 50)
            fear = avoidance * 3;
        if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
            fear = avoidance * 3;
        if (borg.goal.ignoring)
            fear = avoidance * 5;
        if (borg_t - borg_began > 5000)
            fear = avoidance * 25;
        if (borg.trait[BI_FOOD] == 0)
            fear = avoidance * 100;

        /* Normal in town */
        if (borg.trait[BI_CLEVEL] == 0)
            fear = avoidance * 1 / 10;

        /* Mark dangerous grids as icky */
        if (p > fear) {
            /* Icky */
            borg_data_icky->data[y][x] = true;

            /* Avoid */
            return;
        }
    }

    /* Save the flow cost (zero) */
    borg_data_cost->data[y][x] = 0;

    /* Save "origin" */
    y1 = y;
    x1 = x;

    /* Save "destination" */
    y2 = borg.c.y;
    x2 = borg.c.x;

    /* Calculate distance components */
    ay = (y2 < y1) ? (y1 - y2) : (y2 - y1);
    ax = (x2 < x1) ? (x1 - x2) : (x2 - x1);

    /* Path */
    while (1) {
        /* Check for arrival at player */
        if ((x == x2) && (y == y2))
            return;

        /* Next */
        n++;

        /* Move mostly vertically */
        if (ay > ax) {
            /* Extract a shift factor XXX */
            shift = (n * ax + (ay - 1) / 2) / ay;

            /* Sometimes move along the minor axis */
            x = (x2 < x1) ? (x1 - shift) : (x1 + shift);

            /* Always move along major axis */
            y = (y2 < y1) ? (y1 - n) : (y1 + n);
        }

        /* Move mostly horizontally */
        else {
            /* Extract a shift factor XXX */
            shift = (n * ay + (ax - 1) / 2) / ax;

            /* Sometimes move along the minor axis */
            y = (y2 < y1) ? (y1 - shift) : (y1 + shift);

            /* Always move along major axis */
            x = (x2 < x1) ? (x1 - n) : (x1 + n);
        }

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Ignore "wall" grids and lava (unless immune to fire) */
        if (!borg_cave_floor_grid(ag)
            || (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE]))
            return;

        /* Avoid Traps if low level-- unless brave or scaryguy. */
        if (ag->trap && avoidance <= borg.trait[BI_CURHP]
            && !scaryguy_on_level) {
            /* Do not disarm when you could end up dead */
            if (borg.trait[BI_CURHP] < 60)
                return;

            /* Do not disarm when clumsy */
            if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
                return;
            if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
                return;
            if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
                return;
            if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
                return;
        }

        /* Abort at "icky" grids */
        if (borg_data_icky->data[y][x])
            return;

        /* Analyze every grid once */
        if (!borg_data_know->data[y][x]) {
            /* Mark as known */
            borg_data_know->data[y][x] = true;

            /* Get the danger */
            p = borg_danger(y, x, 1, true, false);

            /* Increase bravery */
            if (borg.trait[BI_MAXCLEVEL] == 50)
                fear = avoidance * 5 / 10;
            if (borg.trait[BI_MAXCLEVEL] != 50)
                fear = avoidance * 3 / 10;
            if (scaryguy_on_level)
                fear = avoidance * 2;
            if (unique_on_level && vault_on_level
                && borg.trait[BI_MAXCLEVEL] == 50)
                fear = avoidance * 3;
            if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
                fear = avoidance * 3;
            if (borg.goal.ignoring)
                fear = avoidance * 5;
            if (borg_t - borg_began > 5000)
                fear = avoidance * 25;
            if (borg.trait[BI_FOOD] == 0)
                fear = avoidance * 100;

            /* Normal in town */
            if (borg.trait[BI_CLEVEL] == 0)
                fear = avoidance * 1 / 10;

            /* Avoid dangerous grids (forever) */
            if (p > fear) {
                /* Mark as icky */
                borg_data_icky->data[y][x] = true;

                /* Abort */
                return;
            }
        }

        /* Abort "pointless" paths if possible */
        if (borg_data_cost->data[y][x] <= n)
            break;

        /* Save the new flow cost */
        borg_data_cost->data[y][x] = n;
    }
}